

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

string * __thiscall
flatbuffers::php::PhpGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,PhpGenerator *this,Type *type)

{
  int iVar1;
  char *__s;
  undefined4 local_28;
  undefined4 local_24;
  Parser *local_20;
  string *psStack_18;
  ushort local_10;
  
  iVar1 = *(int *)&(this->super_BaseGenerator)._vptr_BaseGenerator;
  if (iVar1 == 0xf) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(this->super_BaseGenerator).parser_);
  }
  else if (iVar1 == 0xe) {
    local_28 = *(undefined4 *)((long)&(this->super_BaseGenerator)._vptr_BaseGenerator + 4);
    local_10 = *(ushort *)&(this->super_BaseGenerator).file_name_;
    local_24 = 0;
    local_20 = (this->super_BaseGenerator).parser_;
    psStack_18 = (this->super_BaseGenerator).path_;
    GenTypeGet_abi_cxx11_
              (__return_storage_ptr__,(PhpGenerator *)&stack0xffffffffffffffd8,
               (Type *)(ulong)local_10);
  }
  else {
    if (iVar1 == 0xd) {
      __s = "string";
    }
    else {
      __s = "Table";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&stack0xffffffffffffffd8);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenTypePointer(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "string";
      case BASE_TYPE_VECTOR: return GenTypeGet(type.VectorType());
      case BASE_TYPE_STRUCT: return type.struct_def->name;
      case BASE_TYPE_UNION:
        // fall through
      default: return "Table";
    }
  }